

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkFunctionReturns(CheckerVisitor *this,FunctionDecl *func)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  FunctionDecl *in_RSI;
  CheckerVisitor *in_RDI;
  bool powerOfTwo;
  uint flagsDiff;
  bool reported;
  Decl *in_stack_00000020;
  uint returnFlags;
  bool dummy;
  SQChar *name;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar4;
  CheckerVisitor *in_stack_ffffffffffffffd0;
  SQChar *local_18;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    local_18 = FunctionDecl::name(in_RSI);
    if ((local_18 == (SQChar *)0x0) || (*local_18 == '(')) {
      local_18 = findSlotNameInStack(_returnFlags,in_stack_00000020);
    }
    FunctionReturnTypeEvaluator::FunctionReturnTypeEvaluator
              ((FunctionReturnTypeEvaluator *)&stack0xffffffffffffffd0,in_RDI);
    FunctionDecl::body(in_RSI);
    uVar2 = FunctionReturnTypeEvaluator::compute
                      ((FunctionReturnTypeEvaluator *)in_stack_ffffffffffffffd0,
                       (Statement *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (bool *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    uVar4 = 0;
    if (((uVar2 & 0xfffffcf9) != 0) &&
       (bVar1 = nameLooksLikeResultMustBeBoolean((SQChar *)in_RDI), bVar1)) {
      report(in_RDI,(Node *)in_RSI,0x5a,local_18);
      uVar4 = 0x1000000;
    }
    if (((uVar2 & 1) == 0) || ((uVar2 & 0xef8) == 0)) {
      if ((uVar2 != 0) && ((uVar3 = uVar2 & 0xfffff8fc, uVar3 != 0 && ((uVar3 & uVar3 - 1) != 0))))
      {
        report(in_RDI,(Node *)in_RSI,0x4f);
        uVar4 = 0x1000000;
      }
    }
    else {
      if ((uVar2 & 0x400) == 0) {
        report(in_RDI,(Node *)in_RSI,0x4e);
      }
      uVar4 = 0x1000000;
    }
    if ((((uVar4 & 0x1000000) == 0) && ((uVar2 & 1) != 0)) &&
       (bVar1 = nameLooksLikeFunctionMustReturnResult((SQChar *)in_RDI), bVar1)) {
      report(in_RDI,(Node *)in_RSI,0x67,local_18);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkFunctionReturns(FunctionDecl *func) {
  if (effectsOnly)
    return;

  const SQChar *name = func->name();

  if (!name || name[0] == '(') {
    name = findSlotNameInStack(func);
  }

  bool dummy;
  unsigned returnFlags = FunctionReturnTypeEvaluator(this).compute(func->body(), dummy);

  bool reported = false;

  if (returnFlags & ~(RT_BOOL | RT_UNRECOGNIZED | RT_FUNCTION_CALL | RT_NULL)) { // Null is castable to boolean
    if (nameLooksLikeResultMustBeBoolean(name)) {
      report(func, DiagnosticsId::DI_NAME_RET_BOOL, name);
      reported = true;
    }
  }

  if (!!(returnFlags & RT_NOTHING) &&
    !!(returnFlags & (RT_NUMBER | RT_STRING | RT_TABLE | RT_CLASS | RT_ARRAY | RT_CLOSURE | RT_UNRECOGNIZED | RT_THROW)))
  {
    if ((returnFlags & RT_THROW) == 0)
      report(func, DiagnosticsId::DI_NOT_ALL_PATH_RETURN_VALUE);
    reported = true;
  }
  else if (returnFlags)
  {
    unsigned flagsDiff = returnFlags & ~(RT_THROW | RT_NOTHING | RT_NULL | RT_UNRECOGNIZED | RT_FUNCTION_CALL);
    if (flagsDiff)
    {
      bool powerOfTwo = !(flagsDiff & (flagsDiff - 1));
      if (!powerOfTwo)
      {
        report(func, DiagnosticsId::DI_RETURNS_DIFFERENT_TYPES);
        reported = true;
      }
    }
  }

  if (!reported) {
    if (!!(returnFlags & RT_NOTHING) && nameLooksLikeFunctionMustReturnResult(name)) {
      report(func, DiagnosticsId::DI_NAME_EXPECTS_RETURN, name);
    }
  }
}